

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Key.cpp
# Opt level: O2

void MiniScript::KeyPutString(String *s,bool inFront)

{
  ulong uVar1;
  unsigned_long uVar2;
  long lVar3;
  undefined7 in_register_00000031;
  uchar *puVar4;
  int i;
  long numChars;
  InputBufferEntry e;
  String character;
  
  if ((int)CONCAT71(in_register_00000031,inFront) == 0) {
    numChars = 0;
    while( true ) {
      lVar3 = String::Length(s);
      if (lVar3 <= numChars) break;
      e.c = L'\0';
      e.scanCode = L'\0';
      String::Substring(&character,(long)s,numChars);
      puVar4 = "";
      if (character.ss != (StringStorage *)0x0) {
        puVar4 = (uchar *)(character.ss)->data;
      }
      uVar2 = UTF8Decode(puVar4);
      e.c = (wchar_t)uVar2;
      SimpleVector<MiniScript::InputBufferEntry>::push_back
                ((SimpleVector<MiniScript::InputBufferEntry> *)inputBuffer,&e);
      String::release(&character);
      numChars = numChars + 1;
    }
  }
  else {
    uVar1 = String::Length(s);
    uVar1 = uVar1 & 0xffffffff;
    while( true ) {
      uVar1 = uVar1 - 1;
      if ((int)(uint)uVar1 < 0) break;
      e.c = L'\0';
      e.scanCode = L'\0';
      String::Substring(&character,(long)s,(ulong)((uint)uVar1 & 0x7fffffff));
      puVar4 = "";
      if (character.ss != (StringStorage *)0x0) {
        puVar4 = (uchar *)(character.ss)->data;
      }
      uVar2 = UTF8Decode(puVar4);
      e.c = (wchar_t)uVar2;
      SimpleVector<MiniScript::InputBufferEntry>::insert
                ((SimpleVector<MiniScript::InputBufferEntry> *)inputBuffer,&e,0);
      String::release(&character);
    }
  }
  return;
}

Assistant:

void KeyPutString(String s, bool inFront) {
	if (inFront) {
		for (int i=s.Length()-1; i>=0; i--) {
			struct InputBufferEntry e = {0, 0};
			String character = s.Substring(i, 1);
			e.c = UTF8Decode((unsigned char *)character.c_str());
			inputBuffer.insert(e, 0);
		}
	} else {
		for (int i=0; i<s.Length(); i++) {
			struct InputBufferEntry e = {0, 0};
			String character = s.Substring(i, 1);
			e.c = UTF8Decode((unsigned char *)character.c_str());
			inputBuffer.push_back(e);
		}
	}
}